

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::run(Instrumenter *this,Module *wasm)

{
  size_t local_20;
  size_t numFuncs;
  Module *wasm_local;
  Instrumenter *this_local;
  
  this->wasm = wasm;
  local_20 = 0;
  numFuncs = (size_t)wasm;
  wasm_local = (Module *)this;
  ModuleUtils::iterDefinedFunctions<wasm::Instrumenter::run(wasm::Module*)::__0>
            (wasm,(anon_class_8_1_75f803c7)&local_20);
  addGlobals(this,local_20);
  addSecondaryMemory(this,local_20);
  instrumentFuncs(this);
  addProfileExport(this,local_20);
  return;
}

Assistant:

void Instrumenter::run(Module* wasm) {
  this->wasm = wasm;

  size_t numFuncs = 0;
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function*) { ++numFuncs; });

  addGlobals(numFuncs);
  addSecondaryMemory(numFuncs);
  instrumentFuncs();
  addProfileExport(numFuncs);
}